

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# project.cpp
# Opt level: O0

void __thiscall
license::Project::Project
          (Project *this,string *name,string *project_folder,string *source_folder,
          bool force_overwrite)

{
  long lVar1;
  invalid_argument *this_00;
  char cVar2;
  bool force_overwrite_local;
  string *source_folder_local;
  string *project_folder_local;
  string *name_local;
  Project *this_local;
  
  std::__cxx11::string::string((string *)this,(string *)name);
  std::__cxx11::string::string((string *)&this->m_project_folder,(string *)project_folder);
  guess_templates_folder(&this->m_templates_folder,source_folder);
  this->m_force_overwrite = force_overwrite;
  cVar2 = (char)name;
  lVar1 = std::__cxx11::string::find(cVar2,0x5b);
  if (lVar1 == -1) {
    lVar1 = std::__cxx11::string::find(cVar2,0x5d);
    if (lVar1 == -1) {
      lVar1 = std::__cxx11::string::find(cVar2,0x2f);
      if (lVar1 == -1) {
        lVar1 = std::__cxx11::string::find(cVar2,0x5c);
        if (lVar1 == -1) {
          return;
        }
      }
    }
  }
  this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::invalid_argument::invalid_argument
            (this_00,"project name should not contain any of \'[ ] / \' characters.");
  __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

Project::Project(const std::string &name, const std::string &project_folder, const std::string &source_folder,
				 bool force_overwrite)
	: m_name(name),
	  m_project_folder(project_folder),
	  m_templates_folder(guess_templates_folder(source_folder)),
	  m_force_overwrite(force_overwrite) {
	if (name.find('[') != std::string::npos || name.find(']') != std::string::npos ||
		name.find('/') != std::string::npos || name.find('\\') != std::string::npos) {
		throw invalid_argument("project name should not contain any of '[ ] / \' characters.");
	}
}